

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O0

bool GetNameProxy(Proxy *nameProxyOut)

{
  byte bVar1;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  UniqueLock<GlobalMutex> criticalblock8;
  GlobalMutex *in_stack_ffffffffffffffb8;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  char *in_stack_ffffffffffffffe8;
  GlobalMutex *in_stack_fffffffffffffff0;
  UniqueLock<GlobalMutex> *this;
  
  this = *(UniqueLock<GlobalMutex> **)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<GlobalMutex>(in_stack_ffffffffffffffb8);
  UniqueLock<GlobalMutex>::UniqueLock
            (this,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
             (char *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
             (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  bVar1 = Proxy::IsValid((Proxy *)CONCAT17(in_stack_ffffffffffffffc7,
                                           CONCAT16(in_stack_ffffffffffffffc6,
                                                    in_stack_ffffffffffffffc0)));
  if ((bool)bVar1) {
    Proxy::operator=((Proxy *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (Proxy *)CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffffc6,
                                                      in_stack_ffffffffffffffc0)));
  }
  UniqueLock<GlobalMutex>::~UniqueLock((UniqueLock<GlobalMutex> *)in_stack_ffffffffffffffb8);
  if (*(UniqueLock<GlobalMutex> **)(in_FS_OFFSET + 0x28) != this) {
    __stack_chk_fail();
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool GetNameProxy(Proxy &nameProxyOut) {
    LOCK(g_proxyinfo_mutex);
    if(!nameProxy.IsValid())
        return false;
    nameProxyOut = nameProxy;
    return true;
}